

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

void voc_make_obj_name_from_list
               (voccxdef *ctx,char *namebuf,char **cmd,char *firstwrd,char *lastwrd)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar2 = 0;
  uVar3 = 0;
  while ((pcVar1 = cmd[uVar4], pcVar1 != (char *)0x0 && (*pcVar1 != '\0'))) {
    if (pcVar1 == firstwrd) {
      uVar2 = uVar4 & 0xffffffff;
    }
    uVar4 = uVar4 + 1;
    if (pcVar1 == lastwrd) {
      uVar3 = uVar4 & 0xffffffff;
    }
  }
  voc_make_obj_name(ctx,namebuf,cmd,(int)uVar2,(int)uVar3);
  return;
}

Assistant:

void voc_make_obj_name_from_list(voccxdef *ctx, char *namebuf,
                                 char *cmd[], char *firstwrd, char *lastwrd)
{
    int i, i1, i2;
    
    /* find the cmd indices */
    for (i = i1 = i2 = 0 ; cmd[i] != 0 && *cmd[i] != 0 ; ++i)
    {
        if (cmd[i] == firstwrd)
            i1 = i;
        if (cmd[i] == lastwrd)
            i2 = i + 1;
    }

    /* build the name */
    voc_make_obj_name(ctx, namebuf, cmd, i1, i2);
}